

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O1

visuals_color_cycle *
visuals_cycler_cycle_by_name(visuals_cycler *cycler,char *group_name,char *cycle_name)

{
  size_t sVar1;
  visuals_cycle_group **ppvVar2;
  visuals_color_cycle **ppvVar3;
  visuals_color_cycle *pvVar4;
  int iVar5;
  size_t sVar6;
  visuals_cycle_group *pvVar7;
  
  if (group_name != (char *)0x0) {
    if (cycle_name == (char *)0x0) {
      return (visuals_color_cycle *)0x0;
    }
    if (*group_name == '\0') {
      return (visuals_color_cycle *)0x0;
    }
    if (*cycle_name != '\0') {
      sVar1 = cycler->max_groups;
      if (sVar1 != 0) {
        ppvVar2 = cycler->groups;
        sVar6 = 0;
        do {
          pvVar7 = ppvVar2[sVar6];
          iVar5 = strcmp(pvVar7->group_name,group_name);
          if (iVar5 == 0) goto LAB_0020de96;
          sVar6 = sVar6 + 1;
        } while (sVar1 != sVar6);
      }
      pvVar7 = (visuals_cycle_group *)0x0;
LAB_0020de96:
      if ((pvVar7 != (visuals_cycle_group *)0x0) && (sVar1 = pvVar7->max_cycles, sVar1 != 0)) {
        ppvVar3 = pvVar7->cycles;
        sVar6 = 0;
        do {
          pvVar4 = ppvVar3[sVar6];
          iVar5 = strcmp(pvVar4->cycle_name,cycle_name);
          if (iVar5 == 0) {
            return pvVar4;
          }
          sVar6 = sVar6 + 1;
        } while (sVar1 != sVar6);
      }
    }
  }
  return (visuals_color_cycle *)0x0;
}

Assistant:

static struct visuals_color_cycle *visuals_cycler_cycle_by_name(struct visuals_cycler const *cycler,
																const char *group_name,
																const char *cycle_name)
{
	struct visuals_cycle_group *group = NULL;
	struct visuals_color_cycle *cycle = NULL;
	size_t i = 0;

	if (group_name == NULL || strlen(group_name) == 0) {
		return NULL;
	}

	if (cycle_name == NULL || strlen(cycle_name) == 0) {
		return NULL;
	}

	for (i = 0; i < cycler->max_groups; i++) {
		if (streq(cycler->groups[i]->group_name, group_name)) {
			group = cycler->groups[i];
			break;
		}
	}

	if (group == NULL) {
		return NULL;
	}

	for (i = 0; i < group->max_cycles; i++) {
		if (streq(group->cycles[i]->cycle_name, cycle_name)) {
			cycle = group->cycles[i];
			break;
		}
	}

	return cycle;
}